

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialJointPolicyDiscretePure.cpp
# Opt level: O2

PartialJointPolicyDiscretePure * __thiscall
PartialJointPolicyDiscretePure::operator=
          (PartialJointPolicyDiscretePure *this,PartialJointPolicyDiscretePure *o)

{
  if (this != o) {
    JointPolicyDiscretePure::operator=
              (&this->super_JointPolicyDiscretePure,&o->super_JointPolicyDiscretePure);
    PartialJointPolicy::operator=(&this->super_PartialJointPolicy,&o->super_PartialJointPolicy);
  }
  return this;
}

Assistant:

PartialJointPolicyDiscretePure& PartialJointPolicyDiscretePure::operator= (const PartialJointPolicyDiscretePure& o)
{
#if DEBUG_JPOLASSIGN 
    cerr << "PartialJointPolicyDiscretePure& PartialJointPolicyDiscretePure::operator= (const PartialJointPolicyDiscretePure& o) called"<<endl;
#endif

    if (this == &o) return *this;   // Gracefully handle self assignment
    // Put the normal assignment duties here...
    JointPolicyDiscretePure::operator= ( o );
    PartialJointPolicy::operator= ( o );

    return *this;
}